

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O2

int __thiscall pstore::romfs::romfs::stat(romfs *this,char *__file,stat *__buf)

{
  not_null<const_pstore::romfs::dirent_*> *pnVar1;
  error_code eVar2;
  error_code erc;
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_> eStack_28;
  
  parse_path(&eStack_28,(romfs *)__file,(not_null<const_char_*>)__buf);
  if (eStack_28.has_error_ == false) {
    pnVar1 = error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
             value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>&,pstore::gsl::not_null<pstore::romfs::dirent_const*>>
                       (&eStack_28);
    error_or<pstore::romfs::stat>::error_or<pstore::romfs::stat_const&,void>
              ((error_or<pstore::romfs::stat> *)this,&pnVar1->ptr_->stat_);
  }
  else {
    eVar2 = error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::get_error(&eStack_28);
    erc._M_cat = eVar2._M_cat;
    erc._4_4_ = 0;
    erc._M_value = eVar2._M_value;
    error_or<pstore::romfs::stat>::error_or((error_or<pstore::romfs::stat> *)this,erc);
  }
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::~error_or(&eStack_28);
  return (int)this;
}

Assistant:

error_or<struct stat> romfs::stat (not_null<czstring> const path) const {
            return this->parse_path (path) >>=
                   [] (dirent_ptr const de) { return error_or<struct stat>{de->stat ()}; };
        }